

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dgConvexHull3d.cpp
# Opt level: O1

HaI32 __thiscall dgConvexHull3d::BuildNormalList(dgConvexHull3d *this,dgBigVector *normalArray)

{
  HaI32 start;
  HaI32 count;
  dgVector p1;
  dgVector p0;
  dgVector p4;
  dgVector p3;
  dgVector p2;
  dgVector p5;
  
  p0.super_dgTemplateVector<float> = SUB6416(ZEXT464(0x3f800000),0);
  p1.super_dgTemplateVector<float> = SUB6416(ZEXT464(0xbf800000),0);
  p2.super_dgTemplateVector<float>.m_x = 0.0;
  p2.super_dgTemplateVector<float>.m_y = 1.0;
  p2.super_dgTemplateVector<float>.m_z = 0.0;
  p2.super_dgTemplateVector<float>.m_w = 0.0;
  p3.super_dgTemplateVector<float>.m_x = 0.0;
  p3.super_dgTemplateVector<float>.m_y = -1.0;
  p3.super_dgTemplateVector<float>.m_z = 0.0;
  p3.super_dgTemplateVector<float>.m_w = 0.0;
  p4.super_dgTemplateVector<float>.m_x = 0.0;
  p4.super_dgTemplateVector<float>.m_y = 0.0;
  p4.super_dgTemplateVector<float>.m_z = 1.0;
  p4.super_dgTemplateVector<float>.m_w = 0.0;
  p5.super_dgTemplateVector<float>.m_x = 0.0;
  p5.super_dgTemplateVector<float>.m_y = 0.0;
  p5.super_dgTemplateVector<float>.m_z = -1.0;
  p5.super_dgTemplateVector<float>.m_w = 0.0;
  count = 0;
  start = 0;
  TessellateTriangle(this,1,&p4,&p0,&p2,&count,normalArray,&start);
  start = 1;
  TessellateTriangle(this,1,&p5,&p3,&p1,&count,normalArray,&start);
  start = 2;
  TessellateTriangle(this,1,&p5,&p1,&p2,&count,normalArray,&start);
  start = 3;
  TessellateTriangle(this,1,&p4,&p3,&p0,&count,normalArray,&start);
  start = 4;
  TessellateTriangle(this,1,&p4,&p2,&p1,&count,normalArray,&start);
  start = 5;
  TessellateTriangle(this,1,&p5,&p0,&p3,&count,normalArray,&start);
  start = 6;
  TessellateTriangle(this,1,&p5,&p2,&p0,&count,normalArray,&start);
  start = 7;
  TessellateTriangle(this,1,&p4,&p1,&p3,&count,normalArray,&start);
  return count;
}

Assistant:

hacd::HaI32 dgConvexHull3d::BuildNormalList (dgBigVector* const normalArray) const
{
	dgVector p0 ( hacd::HaF32 (1.0f), hacd::HaF32 (0.0f), hacd::HaF32 (0.0f), hacd::HaF32 (0.0f)); 
	dgVector p1 (-hacd::HaF32 (1.0f), hacd::HaF32 (0.0f), hacd::HaF32 (0.0f), hacd::HaF32 (0.0f)); 
	dgVector p2 ( hacd::HaF32 (0.0f), hacd::HaF32 (1.0f), hacd::HaF32 (0.0f), hacd::HaF32 (0.0f)); 
	dgVector p3 ( hacd::HaF32 (0.0f),-hacd::HaF32 (1.0f), hacd::HaF32 (0.0f), hacd::HaF32 (0.0f));
	dgVector p4 ( hacd::HaF32 (0.0f), hacd::HaF32 (0.0f), hacd::HaF32 (1.0f), hacd::HaF32 (0.0f));
	dgVector p5 ( hacd::HaF32 (0.0f), hacd::HaF32 (0.0f),-hacd::HaF32 (1.0f), hacd::HaF32 (0.0f));

	hacd::HaI32 count = 0;
	hacd::HaI32 subdivitions = 1;

	hacd::HaI32 start = 0;
	TessellateTriangle  (subdivitions, p4, p0, p2, count, normalArray, start);
	start = 1;
	TessellateTriangle  (subdivitions, p5, p3, p1, count, normalArray, start);
	start = 2;
	TessellateTriangle  (subdivitions, p5, p1, p2, count, normalArray, start);
	start = 3;
	TessellateTriangle  (subdivitions, p4, p3, p0, count, normalArray, start);
	start = 4;
	TessellateTriangle  (subdivitions, p4, p2, p1, count, normalArray, start);
	start = 5;
	TessellateTriangle  (subdivitions, p5, p0, p3, count, normalArray, start);
	start = 6;
	TessellateTriangle  (subdivitions, p5, p2, p0, count, normalArray, start);
	start = 7;
	TessellateTriangle  (subdivitions, p4, p1, p3, count, normalArray, start);
	return count;
}